

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mark.cpp
# Opt level: O1

Read<signed_char> __thiscall
Omega_h::mark_by_class_dim(Omega_h *this,Mesh *mesh,Int ent_dim,Int class_dim)

{
  int *piVar1;
  Alloc *pAVar2;
  void *pvVar3;
  void *extraout_RDX;
  void *extraout_RDX_00;
  Bytes BVar4;
  Read<signed_char> RVar5;
  Read<signed_char> e2class_dim;
  Read<signed_char> local_68;
  Alloc *local_58;
  element_type *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_48._M_pi = &local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"class_dim","");
  Mesh::get_array<signed_char>((Mesh *)&local_58,(Int)mesh,(string *)(ulong)(uint)ent_dim);
  if (local_48._M_pi != &local_38) {
    operator_delete(local_48._M_pi,(long)local_38._vptr__Sp_counted_base + 1);
  }
  local_68.write_.shared_alloc_.alloc = local_58;
  if (((ulong)local_58 & 7) == 0 && local_58 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_68.write_.shared_alloc_.alloc = (Alloc *)(local_58->size * 8 + 1);
    }
    else {
      local_58->use_count = local_58->use_count + 1;
    }
  }
  local_68.write_.shared_alloc_.direct_ptr = local_50;
  BVar4 = each_eq_to<signed_char>(this,&local_68,(char)class_dim);
  pAVar2 = local_68.write_.shared_alloc_.alloc;
  pvVar3 = BVar4.write_.shared_alloc_.direct_ptr;
  if (((ulong)local_68.write_.shared_alloc_.alloc & 7) == 0 &&
      local_68.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_68.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_68.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar3 = extraout_RDX;
    }
  }
  if (((ulong)local_58 & 7) == 0 && local_58 != (Alloc *)0x0) {
    piVar1 = &local_58->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_58);
      operator_delete(local_58,0x48);
      pvVar3 = extraout_RDX_00;
    }
  }
  RVar5.write_.shared_alloc_.direct_ptr = pvVar3;
  RVar5.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar5.write_.shared_alloc_;
}

Assistant:

Read<I8> mark_by_class_dim(Mesh* mesh, Int ent_dim, Int class_dim) {
  auto e2class_dim = mesh->get_array<I8>(ent_dim, "class_dim");
  return each_eq_to(e2class_dim, static_cast<I8>(class_dim));
}